

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseThread.cpp
# Opt level: O1

void __thiscall BaseThread::Start(BaseThread *this,int detach)

{
  thread local_30;
  BaseThread *local_28;
  offset_in_BaseThread_to_subr local_20 [2];
  
  local_20[0] = 1;
  local_20[1] = 0;
  local_28 = this;
  std::thread::thread<void(BaseThread::*)(),BaseThread*,void>(&local_30,local_20,&local_28);
  if ((this->thread)._M_id._M_thread == 0) {
    (this->thread)._M_id._M_thread = (native_handle_type)local_30._M_id._M_thread;
    if (detach != 0) {
      std::thread::detach();
    }
    return;
  }
  std::terminate();
}

Assistant:

void BaseThread::Start(int detach) {
    thread = std::thread(&BaseThread::Run, this);

    if(detach) {
        thread.detach();
    }
}